

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O3

int fy_token_iter_utf8_get(fy_token_iter *iter)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint left;
  byte *ptr;
  ulong uVar4;
  int local_14;
  
  uVar2 = iter->unget_c;
  if (uVar2 == 0xffffffff) {
    ptr = (byte *)(iter->ic).str;
    if (ptr == (byte *)0x0) {
      iVar1 = fy_atom_iter_utf8_get(&iter->atom_iter);
      return iVar1;
    }
    uVar3 = (iter->ic).len;
    uVar2 = 0xffffffff;
    if (uVar3 != 0) {
      uVar2 = (uint)*ptr;
      if ((char)*ptr < '\0') {
        left = 2;
        if ((((uVar2 & 0xffffffe0) != 0xc0) && (left = 3, (uVar2 & 0xfffffff0) != 0xe0)) &&
           (left = 4, (uVar2 & 0xfffffff8) != 0xf0)) {
          return -1;
        }
        uVar4 = (ulong)left;
        if (uVar3 < uVar4) {
          return -1;
        }
        uVar2 = fy_utf8_get_generic(ptr,left,&local_14);
        ptr = (byte *)(iter->ic).str;
        uVar3 = (iter->ic).len;
      }
      else {
        uVar4 = 1;
      }
      (iter->ic).str = (char *)(ptr + uVar4);
      (iter->ic).len = uVar3 - uVar4;
    }
  }
  else {
    iter->unget_c = -1;
  }
  return uVar2;
}

Assistant:

int fy_token_iter_utf8_get(struct fy_token_iter *iter) {
    int c, w, w1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c;
    }

    /* direct */
    if (iter->ic.str) {

        /* not even 1 octet */
        if (!iter->ic.len)
            return -1;

        /* get width by the first octet */
        w = fy_utf8_width_by_first_octet((uint8_t) *iter->ic.str);
        if (!w || (unsigned int) w > iter->ic.len)
            return -1;

        /* get the next character */
        c = fy_utf8_get(iter->ic.str, w, &w1);

        iter->ic.str += w;
        iter->ic.len -= w;

        return c;
    }

    return fy_atom_iter_utf8_get(&iter->atom_iter);
}